

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::~cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_int> *this)

{
  ~cbtAxisSweep3Internal(this);
  cbtAlignedFreeInternal(this);
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::~cbtAxisSweep3Internal()
{
	if (m_raycastAccelerator)
	{
		m_nullPairCache->~cbtOverlappingPairCache();
		cbtAlignedFree(m_nullPairCache);
		m_raycastAccelerator->~cbtDbvtBroadphase();
		cbtAlignedFree(m_raycastAccelerator);
	}

	for (int i = 2; i >= 0; i--)
	{
		cbtAlignedFree(m_pEdgesRawPtr[i]);
	}
	delete[] m_pHandles;

	if (m_ownsPairCache)
	{
		m_pairCache->~cbtOverlappingPairCache();
		cbtAlignedFree(m_pairCache);
	}
}